

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

TestLog * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,EndMessageToken *param_1)

{
  TestLog *this_00;
  char *msgStr;
  string local_38 [32];
  EndMessageToken *local_18;
  EndMessageToken *param_1_local;
  MessageBuilder *this_local;
  
  this_00 = this->m_log;
  local_18 = param_1;
  param_1_local = (EndMessageToken *)this;
  std::__cxx11::ostringstream::str();
  msgStr = (char *)std::__cxx11::string::c_str();
  TestLog::writeMessage(this_00,msgStr);
  std::__cxx11::string::~string(local_38);
  return this->m_log;
}

Assistant:

TestLog& MessageBuilder::operator<< (const TestLog::EndMessageToken&)
{
	m_log->writeMessage(m_str.str().c_str());
	return *m_log;
}